

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.h
# Opt level: O1

string * __thiscall
tools::xar::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,xar *this,string *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items)

{
  ulong *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  ulong *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (ulong *)delim->_M_string_length;
  for (puVar2 = (ulong *)(delim->_M_dataplus)._M_p; puVar2 != puVar1; puVar2 = puVar2 + 4) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)this);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join(const std::string& delim, const T& items) {
  std::string s;
  for (const auto& item : items) {
    if (!s.empty()) {
      s += delim;
    }
    s += item;
  }
  return s;
}